

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall
CConnman::ThreadOpenConnections
          (CConnman *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          connect,Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  seed_nodes)

{
  CThreadInterrupt *this_00;
  size_type *psVar1;
  ConnectionType CVar2;
  int iVar3;
  ServiceFlags SVar4;
  pointer pcVar5;
  CChainParams *pCVar6;
  byte *pbVar7;
  pointer ppCVar8;
  CNode *pCVar9;
  pointer pCVar10;
  AddrMan *this_01;
  double dVar11;
  long lVar12;
  undefined8 uVar13;
  string_view source_file;
  optional<Network> network;
  _Base_ptr p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  uint16_t uVar21;
  undefined4 uVar22;
  Network NVar23;
  int iVar24;
  time_point tVar25;
  uint64_t uVar26;
  size_t sVar27;
  long lVar28;
  Logger *pLVar29;
  size_type sVar30;
  const_iterator cVar31;
  time_point tVar32;
  duration rel_time;
  microseconds mVar33;
  long in_RCX;
  char *pcVar34;
  ulong uVar35;
  int iVar36;
  iterator __first;
  void *__stat_loc;
  uint uVar37;
  ulong uVar38;
  pointer pcVar39;
  string *strDest;
  pointer pCVar40;
  CAddress *this_02;
  pointer ppCVar41;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar42;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 uVar43;
  uint uVar44;
  longdouble local_490;
  int local_460;
  long local_448;
  long local_438;
  long local_430;
  long local_428;
  duration local_418;
  char *local_3a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_388;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  fixed_seed_networks;
  optional<Network> preferred_net;
  CSemaphoreGrant grant;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  CAddress addr_2;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  outbound_ipv46_peer_netgroups;
  direct_or_indirect local_230;
  uint local_220;
  Network local_218;
  uint32_t uStack_214;
  uint16_t local_210;
  FastRandomContext rng;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock77;
  uint local_170;
  CAddress addrConnect;
  CAddress addr;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_e8;
  vector<CAddress,_std::allocator<CAddress>_> seed_addrs;
  string local_78;
  string local_58;
  long local_38;
  
  pbVar42 = seed_nodes.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&rng,false);
  if ((pbVar42->_M_dataplus)._M_p == (pointer)pbVar42->_M_string_length) {
    tVar25 = NodeClock::now();
    lVar12 = (long)tVar25.__d.__r / 1000;
    uVar26 = FastRandomContext::rand64(&rng);
    dVar11 = MakeExponentiallyDistributed(uVar26);
    local_490 = (longdouble)0.5;
    local_430 = (long)ROUND(local_490 + (longdouble)(dVar11 * 120000000.0)) + lVar12;
    uVar26 = FastRandomContext::rand64(&rng);
    dVar11 = MakeExponentiallyDistributed(uVar26);
    local_428 = (long)ROUND(local_490 + (longdouble)(dVar11 * 300000000.0)) + lVar12;
    uVar26 = FastRandomContext::rand64(&rng);
    dVar11 = MakeExponentiallyDistributed(uVar26);
    local_438 = (long)ROUND(local_490 + (longdouble)(dVar11 * 300000000.0)) + lVar12;
    psVar1 = &addr.super_CService.super_CNetAddr.m_addr._size;
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"-dnsseed","");
    bVar15 = ArgsManager::GetBoolArg(&gArgs,(string *)&addr,true);
    uVar43 = CONCAT13(bVar15,(int3)in_stack_fffffffffffffb68);
    if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
        psVar1) {
      operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                      CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                               addr.super_CService.super_CNetAddr.m_addr._size) + 1);
    }
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"-fixedseeds","");
    bVar15 = ArgsManager::GetBoolArg(&gArgs,(string *)&addr,true);
    if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
        psVar1) {
      operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                      CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                               addr.super_CService.super_CNetAddr.m_addr._size) + 1);
    }
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"-seednode","");
    bVar16 = ArgsManager::IsArgSet(&gArgs,(string *)&addr);
    if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
        psVar1) {
      operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                      CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                               addr.super_CService.super_CNetAddr.m_addr._size) + 1);
    }
    local_418.__r = (rep)NodeClock::now();
    sVar27 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    uVar22 = (undefined4)CONCAT71((int7)(sVar27 >> 8),sVar27 == 0);
    if (!bVar15) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_00._M_len = 0x50;
      logging_function._M_str = "ThreadOpenConnections";
      logging_function._M_len = 0x15;
      ::LogPrintf_<>(logging_function,source_file_00,0x9c1,ALL,Info,"Fixed seeds are disabled\n");
    }
    uVar44 = CONCAT31((int3)((uint)uVar22 >> 8),(byte)uVar22 & in_RCX != 0);
    this_00 = &this->interruptNet;
    uVar43 = CONCAT13((byte)((uint)uVar43 >> 0x18) | bVar16,(int3)uVar43);
    local_448 = in_RCX;
    do {
      bVar16 = CThreadInterrupt::operator_cast_to_bool(this_00);
      if (bVar16) break;
      if ((uVar44 & 1) != 0) {
        local_448 = local_448 + -1;
        strDest = (string *)(local_448 * 0x20 + seed_nodes.m_size);
        AddAddrFetch(this,strDest);
        sVar27 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
        if (sVar27 == 0) {
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_02._M_len = 0x50;
          logging_function_01._M_str = "ThreadOpenConnections";
          logging_function_01._M_len = 0x15;
          ::LogPrintf_<std::__cxx11::string>
                    (logging_function_01,source_file_02,0x9cc,ALL,Info,
                     "Empty addrman, adding seednode (%s) to addrfetch\n",strDest);
        }
        else {
          addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0xa;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_01._M_len = 0x50;
          logging_function_00._M_str = "ThreadOpenConnections";
          logging_function_00._M_len = 0x15;
          LogPrintf_<long,std::__cxx11::string>
                    (logging_function_00,source_file_01,0x9ce,ALL,Info,
                     "Couldn\'t connect to peers from addrman after %d seconds. Adding seednode (%s) to addrfetch\n"
                     ,(long *)&addr,strDest);
        }
        uVar44 = 0;
      }
      ProcessAddrFetch(this);
      __stat_loc = (void *)0x1dcd6500;
      bVar16 = CThreadInterrupt::sleep_for(this_00,(duration)0x1dcd6500);
      if (!bVar16) break;
      PerformReconnections(this);
      grant.sem = (this->semOutbound)._M_t.
                  super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                  super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                  super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
      grant.fHaveGrant = false;
      CSemaphore::wait(grant.sem,__stat_loc);
      grant.fHaveGrant = true;
      bVar16 = CThreadInterrupt::operator_cast_to_bool(this_00);
      iVar24 = 1;
      if (!bVar16) {
        GetReachableEmptyNetworks(&fixed_seed_networks,this);
        if ((bVar15 != false) && (fixed_seed_networks._M_h._M_element_count != 0)) {
          tVar25 = NodeClock::now();
          lVar28 = ((long)tVar25.__d.__r / 1000000000) * 1000000;
          if (lVar28 - (lVar12 + 60000000) == 0 || lVar28 < lVar12 + 60000000) {
            if ((char)((uint)uVar43 >> 0x18) == '\0') {
              addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
                   addr.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
              addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   (char *)&this->m_added_nodes_mutex;
              std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&addr);
              if ((this->m_added_node_params).
                  super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  (this->m_added_node_params).
                  super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                source_file_09._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file_09._M_len = 0x50;
                pcVar34 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
                logging_function_08._M_str = "ThreadOpenConnections";
                logging_function_08._M_len = 0x15;
                ::LogPrintf_<>(logging_function_08,source_file_09,0x9ef,ALL,Info,
                               "Adding fixed seeds as -dnsseed=0 (or IPv4/IPv6 connections are disabled via -onlynet) and neither -addnode nor -seednode are provided\n"
                              );
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addr);
                goto LAB_008dbce0;
              }
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addr);
            }
          }
          else {
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
            source_file_03._M_len = 0x50;
            pcVar34 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
            logging_function_02._M_str = "ThreadOpenConnections";
            logging_function_02._M_len = 0x15;
            ::LogPrintf_<>(logging_function_02,source_file_03,0x9e7,ALL,Info,
                           "Adding fixed seeds as 60 seconds have passed and addrman is empty for at least one reachable network\n"
                          );
LAB_008dbce0:
            pCVar6 = this->m_params;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            FastRandomContext::FastRandomContext((FastRandomContext *)&addr,false);
            pbVar7 = (pCVar6->vFixedSeeds).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sp.m_size = (long)(pCVar6->vFixedSeeds).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pbVar7;
            sp.m_data = pbVar7;
            DataStream::DataStream((DataStream *)&addrConnect,sp);
            addr_2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "\x01";
            addr_2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
                 addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect;
            addr_2.super_CService.super_CNetAddr.m_addr._16_8_ =
                 addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_;
            addr_2.super_CService.super_CNetAddr.m_net =
                 addrConnect.super_CService.super_CNetAddr.m_addr._size;
            addr_2.super_CService.super_CNetAddr.m_scope_id =
                 addrConnect.super_CService.super_CNetAddr.m_addr._20_4_;
            addr_2.super_CService._32_8_ = addrConnect.super_CService.super_CNetAddr._24_8_;
            addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                 (char *)0x0;
            addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
            addrConnect.super_CService.super_CNetAddr.m_addr._size = 0;
            addrConnect.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                       &addrConnect);
            while (addr_2.super_CService._32_8_ +
                   addr_2.super_CService.super_CNetAddr.m_addr._union._8_8_ !=
                   addr_2.super_CService.super_CNetAddr.m_addr._16_8_) {
              CService::CService((CService *)&outbound_ipv46_peer_netgroups);
              CNetAddr::Unserialize<ParamsStream<DataStream,CAddress::SerParams>>
                        ((CNetAddr *)&outbound_ipv46_peer_netgroups,
                         (ParamsStream<DataStream,_CAddress::SerParams> *)&addr_2);
              addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   (char *)0x0;
              DataStream::read((DataStream *)
                               ((long)&addr_2.super_CService.super_CNetAddr.m_addr._union + 8),
                               (int)&addrConnect.super_CService.super_CNetAddr.m_addr._union + 6,
                               (void *)0x2,(size_t)pcVar34);
              outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)
                   CONCAT62(outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_right._2_6_,
                            (ushort)(byte)((ulong)addrConnect.super_CService.super_CNetAddr.m_addr.
                                                  _union._0_8_ >> 0x38) |
                            (ushort)((ulong)addrConnect.super_CService.super_CNetAddr.m_addr._union.
                                            _0_8_ >> 0x28) & 0xff00);
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock77,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &outbound_ipv46_peer_netgroups);
              p_Var14 = outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left;
              uVar21 = (uint16_t)
                       outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_right;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrConnect,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock77);
              addrConnect.super_CService.super_CNetAddr._24_8_ = p_Var14;
              addrConnect.super_CService.port = uVar21;
              addrConnect.nTime.__d.__r = (duration)100000000;
              addrConnect.nServices = NODE_WITNESS|NODE_NETWORK;
              if (0x10 < local_170) {
                free(criticalblock77.super_unique_lock._M_device);
                criticalblock77.super_unique_lock._M_device = (mutex_type *)0x0;
              }
              tVar25 = NodeClock::now();
              pcVar34 = (char *)0x112e0be826d694b3;
              do {
                uVar26 = RandomMixin<FastRandomContext>::randbits
                                   ((RandomMixin<FastRandomContext> *)&addr,0x14);
              } while (0x93a7f < uVar26);
              addrConnect.nTime.__d.__r =
                   (duration)(((long)tVar25.__d.__r / 1000000000 - uVar26) + -0x93a80);
              pLVar29 = LogInstance();
              bVar15 = BCLog::Logger::WillLogCategoryLevel(pLVar29,NET,Debug);
              if (bVar15) {
                CService::ToStringAddrPort_abi_cxx11_(&local_78,&addrConnect.super_CService);
                source_file_04._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file_04._M_len = 0x50;
                pcVar34 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
                logging_function_03._M_str = "ConvertSeeds";
                logging_function_03._M_len = 0xc;
                ::LogPrintf_<std::__cxx11::string>
                          (logging_function_03,source_file_04,0xcf,NET,Debug,
                           "Added hardcoded seed: %s\n",&local_78);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
              }
              std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&seed_addrs,&addrConnect);
              if (0x10 < addrConnect.super_CService.super_CNetAddr.m_addr._size) {
                free(addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
                     indirect);
                addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
              if (0x10 < (uint)outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent) {
                free((void *)outbound_ipv46_peer_netgroups._M_t._M_impl._0_8_);
                outbound_ipv46_peer_netgroups._M_t._M_impl._0_8_ = 0;
              }
            }
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                       ((long)&addr_2.super_CService.super_CNetAddr.m_addr._union + 8));
            ChaCha20::~ChaCha20((ChaCha20 *)&addr.super_CService.super_CNetAddr.m_addr._size);
            pCVar10 = seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            lVar28 = ((long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 >> 2
            ;
            pCVar40 = seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (0 < lVar28) {
              lVar28 = lVar28 + 1;
              do {
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)pCVar40);
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                __first._M_current = pCVar40;
                if (sVar30 == 0) goto LAB_008dc1bf;
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)(pCVar40 + 1));
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                __first._M_current = pCVar40 + 1;
                if (sVar30 == 0) goto LAB_008dc1bf;
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)(pCVar40 + 2));
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                __first._M_current = pCVar40 + 2;
                if (sVar30 == 0) goto LAB_008dc1bf;
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)(pCVar40 + 3));
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                __first._M_current = pCVar40 + 3;
                if (sVar30 == 0) goto LAB_008dc1bf;
                pCVar40 = pCVar40 + 4;
                lVar28 = lVar28 + -1;
              } while (1 < lVar28);
            }
            lVar28 = ((long)pCVar10 - (long)pCVar40 >> 3) * 0x6db6db6db6db6db7;
            if (lVar28 == 1) {
LAB_008dc191:
              NVar23 = CNetAddr::GetNetwork((CNetAddr *)pCVar40);
              addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
              sVar30 = std::
                       _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
              __first._M_current = pCVar40;
              if (sVar30 != 0) {
                __first._M_current = pCVar10;
              }
            }
            else if (lVar28 == 2) {
LAB_008dc164:
              NVar23 = CNetAddr::GetNetwork((CNetAddr *)pCVar40);
              addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
              sVar30 = std::
                       _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
              __first._M_current = pCVar40;
              if (sVar30 != 0) {
                pCVar40 = pCVar40 + 1;
                goto LAB_008dc191;
              }
            }
            else {
              __first._M_current = pCVar10;
              if (lVar28 == 3) {
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)pCVar40);
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                __first._M_current = pCVar40;
                if (sVar30 != 0) {
                  pCVar40 = pCVar40 + 1;
                  goto LAB_008dc164;
                }
              }
            }
LAB_008dc1bf:
            this_02 = __first._M_current + 1;
            if (this_02 != pCVar10 && __first._M_current != pCVar10) {
              do {
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)this_02);
                addr.super_CService.super_CNetAddr.m_addr._union._0_4_ = NVar23;
                sVar30 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&fixed_seed_networks._M_h,(key_type *)&addr);
                if (sVar30 != 0) {
                  if (0x10 < *(uint *)((direct_or_indirect *)
                                       &((__first._M_current)->super_CService).super_CNetAddr + 1))
                  {
                    free((((direct_or_indirect *)
                          &((__first._M_current)->super_CService).super_CNetAddr)->indirect_contents
                         ).indirect);
                  }
                  uVar13 = *(undefined8 *)
                            ((long)&(this_02->super_CService).super_CNetAddr.m_addr._union + 8);
                  (((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr)->
                  indirect_contents).indirect =
                       (this_02->super_CService).super_CNetAddr.m_addr._union.indirect_contents.
                       indirect;
                  *(undefined8 *)((long)&((__first._M_current)->super_CService).super_CNetAddr + 8)
                       = uVar13;
                  *(size_type *)
                   ((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr + 1
                   ) = (this_02->super_CService).super_CNetAddr.m_addr._size;
                  (this_02->super_CService).super_CNetAddr.m_addr._size = 0;
                  *(undefined8 *)
                   (((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr)->
                    direct + 0x18) = *(undefined8 *)&(this_02->super_CService).super_CNetAddr.m_net;
                  ((__first._M_current)->super_CService).port = (this_02->super_CService).port;
                  SVar4 = this_02->nServices;
                  ((__first._M_current)->nTime).__d.__r = (this_02->nTime).__d.__r;
                  (__first._M_current)->nServices = SVar4;
                  __first._M_current = __first._M_current + 1;
                }
                this_02 = this_02 + 1;
              } while (this_02 != pCVar10);
            }
            std::vector<CAddress,_std::allocator<CAddress>_>::_M_erase
                      (&seed_addrs,__first,
                       (iterator)
                       seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            CNetAddr::CNetAddr((CNetAddr *)&addr);
            addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                 (char *)&addrConnect.super_CService.super_CNetAddr.m_addr._size;
            std::__cxx11::string::_M_construct<char_const*>((string *)&addrConnect,"fixedseeds","");
            CNetAddr::SetInternal((CNetAddr *)&addr,(string *)&addrConnect);
            if ((size_type *)
                addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect
                != &addrConnect.super_CService.super_CNetAddr.m_addr._size) {
              operator_delete(addrConnect.super_CService.super_CNetAddr.m_addr._union.
                              indirect_contents.indirect,
                              addrConnect.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
            }
            pcVar34 = (char *)0x8dc2fc;
            AddrMan::Add(this->addrman,&seed_addrs,(CNetAddr *)&addr,(seconds)0x0);
            addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                 (char *)(((long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7
                         );
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
            source_file_05._M_len = 0x50;
            logging_function_04._M_str = "ThreadOpenConnections";
            logging_function_04._M_len = 0x15;
            LogPrintf_<unsigned_long>
                      (logging_function_04,source_file_05,0xa02,
                       IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|PRUNE|RAND|CMPCTBLOCK|SELECTCOINS|
                       ADDRMAN|RPC|ZMQ,(Level)&addrConnect,pcVar34,
                       (unsigned_long *)CONCAT44(uVar44,uVar43));
            if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
              free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
              addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   (char *)0x0;
            }
            std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&seed_addrs);
            bVar15 = false;
          }
        }
        CService::CService(&addrConnect.super_CService);
        addrConnect.nTime.__d.__r = (duration)100000000;
        addrConnect.nServices = NODE_NONE;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
        ;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        criticalblock77.super_unique_lock._8_8_ =
             criticalblock77.super_unique_lock._8_8_ & 0xffffffffffffff00;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        criticalblock77.super_unique_lock._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
        std::unique_lock<std::recursive_mutex>::lock(&criticalblock77.super_unique_lock);
        ppCVar41 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar8 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar41 == ppCVar8) {
          local_460 = 0;
          iVar36 = 0;
          uVar37 = 0;
        }
        else {
          uVar37 = 0;
          iVar36 = 0;
          local_460 = 0;
          do {
            pCVar9 = *ppCVar41;
            CVar2 = pCVar9->m_conn_type;
            local_490 = (longdouble)CONCAT91(local_490._1_9_,CVar2 == BLOCK_RELAY);
            if ((CVar2 < ADDR_FETCH) && ((0x16U >> (CVar2 & 0x1f) & 1) != 0)) {
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&pCVar9->addr);
              addr.super_CService.super_CNetAddr.m_net =
                   (pCVar9->addr).super_CService.super_CNetAddr.m_net;
              addr.super_CService.super_CNetAddr.m_scope_id =
                   (pCVar9->addr).super_CService.super_CNetAddr.m_scope_id;
              addr.super_CService.port = (pCVar9->addr).super_CService.port;
              addr.nTime.__d.__r = (duration)(pCVar9->addr).nTime.__d.__r;
              addr.nServices = (pCVar9->addr).nServices;
              if (addr.super_CService.super_CNetAddr.m_net - NET_ONION < 3) {
                local_460 = local_460 + 1;
              }
              else {
                NetGroupManager::GetGroup
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&addr_2,
                           this->m_netgroupman,(CNetAddr *)&addr);
                std::
                _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ::_M_insert_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            *)&outbound_ipv46_peer_netgroups,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&addr_2);
                if (addr_2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
                    (char *)0x0) {
                  operator_delete(addr_2.super_CService.super_CNetAddr.m_addr._union.
                                  indirect_contents.indirect,
                                  addr_2.super_CService.super_CNetAddr.m_addr._16_8_ -
                                  addr_2.super_CService.super_CNetAddr.m_addr._union._0_8_);
                }
              }
              if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
                free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
                addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
            }
            uVar37 = uVar37 + (CVar2 == OUTBOUND_FULL_RELAY);
            iVar36 = iVar36 + (uint)(CVar2 == BLOCK_RELAY);
            ppCVar41 = ppCVar41 + 1;
          } while (ppCVar41 != ppCVar8);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock77.super_unique_lock);
        if (((local_448 != 0) && (uVar37 < 2)) &&
           (tVar25 = NodeClock::now(), local_418.__r + 10000000000 < (long)tVar25.__d.__r)) {
          uVar44 = (uint)CONCAT71(tVar25.__d.__r._1_7_,1);
          local_418.__r = (rep)NodeClock::now();
        }
        tVar25 = NodeClock::now();
        preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
        super__Optional_payload_base<Network>._4_4_ =
             preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
             super__Optional_payload_base<Network>._4_4_ & 0xffffff00;
        bVar16 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar3 = this->m_max_outbound_block_relay;
        if (iVar3 > iVar36 && !bVar16) {
LAB_008dc655:
          local_490 = (longdouble)CONCAT64(local_490._4_6_,4);
          bVar20 = false;
          goto LAB_008dc670;
        }
        if ((int)uVar37 < this->m_max_outbound_full_relay) {
LAB_008dc666:
          bVar20 = false;
          local_490 = (longdouble)CONCAT64(local_490._4_6_,1);
          goto LAB_008dc670;
        }
        local_490 = (longdouble)CONCAT64(local_490._4_6_,4);
        if (iVar36 < iVar3) goto LAB_008dc655;
        if (((this->m_try_another_outbound_peer)._M_base._M_i & 1U) != 0) goto LAB_008dc666;
        lVar28 = (long)tVar25.__d.__r / 1000;
        if ((local_428 < lVar28) &&
           (((this->m_start_extra_block_relay_peers)._M_base._M_i & 1U) != 0)) {
          uVar26 = FastRandomContext::rand64(&rng);
          dVar11 = MakeExponentiallyDistributed(uVar26);
          local_428 = lVar28 + (long)ROUND(dVar11 * 300000000.0 + 0.5);
          bVar20 = false;
LAB_008dc670:
          AddrMan::ResolveCollisions(this->addrman);
          uVar37 = 0;
          tVar25 = NodeClock::now();
          do {
            while( true ) {
              bVar17 = CThreadInterrupt::operator_cast_to_bool(this_00);
              if (bVar17) goto LAB_008dd19d;
              if ((iVar3 <= iVar36 || bVar16) ||
                 (pCVar10 = (this->m_anchors).
                            super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                            super__Vector_impl_data._M_finish,
                 (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_start == pCVar10)) break;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)(pCVar10 + -1));
              addr.super_CService.super_CNetAddr.m_net =
                   pCVar10[-1].super_CService.super_CNetAddr.m_net;
              addr.super_CService.super_CNetAddr.m_scope_id =
                   pCVar10[-1].super_CService.super_CNetAddr.m_scope_id;
              addr.super_CService.port = pCVar10[-1].super_CService.port;
              addr.nTime.__d.__r = (duration)pCVar10[-1].nTime.__d.__r;
              addr.nServices = pCVar10[-1].nServices;
              pCVar40 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pCVar10 = pCVar40 + -1;
              (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_finish = pCVar10;
              if (0x10 < pCVar40[-1].super_CService.super_CNetAddr.m_addr._size) {
                free((pCVar10->super_CService).super_CNetAddr.m_addr._union.indirect_contents.
                     indirect);
                (pCVar10->super_CService).super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
              bVar18 = CNetAddr::IsValid((CNetAddr *)&addr);
              bVar17 = true;
              if ((!bVar18) || (bVar18 = IsLocal(&addr.super_CService), bVar18)) {
LAB_008dc7bd:
                bVar18 = false;
              }
              else {
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)&addr);
                bVar18 = ReachableNets::Contains(&g_reachable_nets,NVar23);
                if ((!bVar18) ||
                   (iVar24 = (*this->m_msgproc->_vptr_NetEventsInterface[2])
                                       (this->m_msgproc,addr.nServices), (char)iVar24 == '\0'))
                goto LAB_008dc7bd;
                NetGroupManager::GetGroup(&local_388,this->m_netgroupman,(CNetAddr *)&addr);
                cVar31 = std::
                         _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::find(&outbound_ipv46_peer_netgroups._M_t,&local_388);
                bVar17 = (_Rb_tree_header *)cVar31._M_node !=
                         &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header;
                bVar18 = true;
              }
              if ((bVar18) &&
                 (local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                operator_delete(local_388.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_388.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_388.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (!bVar17) {
                prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                          ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrConnect,
                           (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
                addrConnect.super_CService.super_CNetAddr.m_net =
                     addr.super_CService.super_CNetAddr.m_net;
                addrConnect.super_CService.super_CNetAddr.m_scope_id =
                     addr.super_CService.super_CNetAddr.m_scope_id;
                addrConnect.super_CService.port = addr.super_CService.port;
                addrConnect.nTime = addr.nTime;
                addrConnect.nServices = addr.nServices;
                pLVar29 = LogInstance();
                bVar18 = BCLog::Logger::WillLogCategoryLevel(pLVar29,NET,Debug);
                if (bVar18) {
                  CService::ToStringAddrPort_abi_cxx11_
                            ((string *)&addr_2,&addrConnect.super_CService);
                  source_file_06._M_str =
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ;
                  source_file_06._M_len = 0x50;
                  logging_function_05._M_str = "ThreadOpenConnections";
                  logging_function_05._M_len = 0x15;
                  ::LogPrintf_<std::__cxx11::string>
                            (logging_function_05,source_file_06,0xa90,NET,Debug,
                             "Trying to make an anchor connection to %s\n",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &addr_2);
                  if ((size_type *)
                      addr_2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect
                      != &addr_2.super_CService.super_CNetAddr.m_addr._size) {
                    operator_delete(addr_2.super_CService.super_CNetAddr.m_addr._union.
                                    indirect_contents.indirect,
                                    addr_2.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
                  }
                }
              }
              if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
                free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
                addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
              if (!bVar17) goto LAB_008dd19d;
            }
            if (uVar37 == 100) break;
            CService::CService(&addr_2.super_CService);
            addr_2.nTime.__d.__r = (duration)100000000;
            addr_2.nServices = NODE_NONE;
            if (bVar20) {
              AddrMan::SelectTriedCollision
                        ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                          *)&addr,this->addrman);
              if (0x10 < addr_2.super_CService.super_CNetAddr.m_addr._size) {
                free(addr_2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
              }
              addr_2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect;
              addr_2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
                   addr.super_CService.super_CNetAddr.m_addr._union._8_8_;
              addr_2.super_CService.super_CNetAddr.m_addr._size =
                   addr.super_CService.super_CNetAddr.m_addr._size;
              addr.super_CService.super_CNetAddr.m_addr._size = 0;
              addr_2.super_CService.super_CNetAddr.m_net = addr.super_CService.super_CNetAddr.m_net;
              addr_2.super_CService.super_CNetAddr.m_scope_id =
                   addr.super_CService.super_CNetAddr.m_scope_id;
              addr_2.super_CService.port = addr.super_CService.port;
              addr_2.nTime = addr.nTime;
              addr_2.nServices = addr.nServices;
              bVar17 = CNetAddr::IsValid((CNetAddr *)&addr_2);
              if (!bVar17) {
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&addr,this->addrman,true,(optional<Network>)0x0);
                goto LAB_008dca87;
              }
              bVar17 = AlreadyConnectedToAddress(this,&addr_2);
              if (bVar17) {
                this_01 = this->addrman;
                tVar32 = NodeClock::now();
                AddrMan::Good(this_01,&addr_2.super_CService,
                              (NodeSeconds)((long)tVar32.__d.__r / 1000000000));
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&addr,this->addrman,true,(optional<Network>)0x0);
                goto LAB_008dca87;
              }
            }
            else {
              network.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network>._M_engaged =
                   preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                   super__Optional_payload_base<Network>._M_engaged;
              network.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network>._5_3_ =
                   preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                   super__Optional_payload_base<Network>._5_3_;
              network.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network>._M_payload._M_value =
                   preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                   super__Optional_payload_base<Network>._M_payload._M_value;
              AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                               *)&addr,this->addrman,false,network);
LAB_008dca87:
              if (0x10 < addr_2.super_CService.super_CNetAddr.m_addr._size) {
                free(addr_2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
              }
              addr_2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect;
              addr_2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
                   addr.super_CService.super_CNetAddr.m_addr._union._8_8_;
              addr_2.super_CService.super_CNetAddr.m_addr._size =
                   addr.super_CService.super_CNetAddr.m_addr._size;
              addr.super_CService.super_CNetAddr.m_addr._size = 0;
              addr_2.super_CService.super_CNetAddr.m_net = addr.super_CService.super_CNetAddr.m_net;
              addr_2.super_CService.super_CNetAddr.m_scope_id =
                   addr.super_CService.super_CNetAddr.m_scope_id;
              addr_2.super_CService.port = addr.super_CService.port;
              addr_2.nTime = addr.nTime;
              addr_2.nServices = addr.nServices;
            }
            if (bVar20) {
              bVar17 = false;
            }
            else {
              NetGroupManager::GetGroup(&local_3a0,this->m_netgroupman,(CNetAddr *)&addr_2);
              cVar31 = std::
                       _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::find(&outbound_ipv46_peer_netgroups._M_t,&local_3a0);
              bVar17 = (_Rb_tree_header *)cVar31._M_node !=
                       &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header;
              if (local_3a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_3a0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_3a0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_3a0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            if (bVar17) {
LAB_008dcb75:
              bVar17 = true;
            }
            else {
              bVar17 = CNetAddr::IsValid((CNetAddr *)&addr_2);
              if ((!bVar17) || (bVar17 = IsLocal(&addr_2.super_CService), bVar17)) {
LAB_008dcb9c:
                bVar17 = false;
              }
              else {
                NVar23 = CNetAddr::GetNetwork((CNetAddr *)&addr_2);
                bVar17 = ReachableNets::Contains(&g_reachable_nets,NVar23);
                if ((!bVar17) ||
                   ((long)local_e8.__d.__r * -1000000000 + (long)tVar25.__d.__r < 600000000000 &&
                    uVar37 < 0x1d)) goto LAB_008dcb75;
                if (bVar20) {
                  bVar17 = true;
                  if ((addr_2.nServices & (NODE_NETWORK_LIMITED|NODE_NETWORK)) != NODE_NONE) {
LAB_008dcc5e:
                    if ((uVar37 < 0x31) &&
                       (addr_2.super_CService.super_CNetAddr.m_net - NET_IPV4 < 2)) {
                      uVar21 = CService::GetPort(&addr_2.super_CService);
                      bVar18 = IsBadPort(uVar21);
                      bVar17 = true;
                      if (bVar18) goto LAB_008dcb9f;
                    }
                    bVar17 = AddedNodesContain(this,&addr_2);
                    if (!bVar17) {
                      prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrConnect,
                                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_2);
                      addrConnect.super_CService.super_CNetAddr.m_net =
                           addr_2.super_CService.super_CNetAddr.m_net;
                      addrConnect.super_CService.super_CNetAddr.m_scope_id =
                           addr_2.super_CService.super_CNetAddr.m_scope_id;
                      addrConnect.super_CService.port = addr_2.super_CService.port;
                      addrConnect.nTime = (NodeSeconds)addr_2.nTime.__d.__r;
                      addrConnect.nServices = addr_2.nServices;
                      goto LAB_008dcb9c;
                    }
                    pLVar29 = LogInstance();
                    bVar18 = BCLog::Logger::WillLogCategoryLevel(pLVar29,NET,Debug);
                    bVar17 = true;
                    if (bVar18) {
                      local_3a8 = "";
                      pcVar34 = "network-specific ";
                      if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                          super__Optional_payload_base<Network>._M_engaged != false) {
                        local_3a8 = "network-specific ";
                      }
                      ConnectionTypeAsString_abi_cxx11_(&local_2b8,local_490._0_4_);
                      NVar23 = CNetAddr::GetNetwork((CNetAddr *)&addr_2);
                      GetNetworkName_abi_cxx11_(&local_2d8,NVar23);
                      bVar18 = fLogIPs;
                      if (fLogIPs == true) {
                        CService::ToStringAddrPort_abi_cxx11_(&local_318,&addr_2.super_CService);
                        tinyformat::format<std::__cxx11::string>
                                  (&local_2f8,(tinyformat *)0xfc4f13,(char *)&local_318,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pcVar34);
                      }
                      else {
                        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
                      }
                      pLVar29 = LogInstance();
                      bVar19 = BCLog::Logger::Enabled(pLVar29);
                      if (bVar19) {
                        addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect
                             = (char *)&addr.super_CService.super_CNetAddr.m_addr._size;
                        addr.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
                        addr.super_CService.super_CNetAddr.m_addr._size =
                             addr.super_CService.super_CNetAddr.m_addr._size & 0xffffff00;
                        tinyformat::
                        format<char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                  (&local_58,
                                   (tinyformat *)
                                   "Not making automatic %s%s connection to %s peer selected for manual (addnode) connection%s\n"
                                   ,(char *)&local_3a8,(char **)&local_2b8,&local_2d8,&local_2f8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(uVar44,uVar43));
                        ThreadOpenConnections();
                        pLVar29 = LogInstance();
                        criticalblock77.super_unique_lock._M_device = (mutex_type *)&DAT_00000050;
                        criticalblock77.super_unique_lock._8_8_ = anon_var_dwarf_2d824f8;
                        source_file._M_str =
                             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                        ;
                        source_file._M_len = 0x50;
                        str._M_str = addr.super_CService.super_CNetAddr.m_addr._union.
                                     indirect_contents.indirect;
                        str._M_len = addr.super_CService.super_CNetAddr.m_addr._union._8_8_;
                        logging_function_09._M_str = "ThreadOpenConnections";
                        logging_function_09._M_len = 0x15;
                        BCLog::Logger::LogPrintStr
                                  (pLVar29,str,logging_function_09,source_file,0xae1,NET,Debug);
                        if ((size_type *)
                            addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
                            indirect != &addr.super_CService.super_CNetAddr.m_addr._size) {
                          operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.
                                          indirect_contents.indirect,
                                          CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                                                   addr.super_CService.super_CNetAddr.m_addr._size)
                                          + 1);
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                        operator_delete(local_2f8._M_dataplus._M_p,
                                        local_2f8.field_2._M_allocated_capacity + 1);
                      }
                      if ((bVar18 != false) &&
                         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_318._M_dataplus._M_p != &local_318.field_2)) {
                        operator_delete(local_318._M_dataplus._M_p,
                                        local_318.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                        operator_delete(local_2d8._M_dataplus._M_p,
                                        local_2d8.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                        operator_delete(local_2b8._M_dataplus._M_p,
                                        local_2b8.field_2._M_allocated_capacity + 1);
                      }
                    }
                  }
                }
                else {
                  iVar24 = (*this->m_msgproc->_vptr_NetEventsInterface[2])
                                     (this->m_msgproc,addr_2.nServices);
                  bVar17 = true;
                  if ((char)iVar24 != '\0') goto LAB_008dcc5e;
                }
              }
            }
LAB_008dcb9f:
            if (0x10 < addr_2.super_CService.super_CNetAddr.m_addr._size) {
              free(addr_2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
              addr_2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                   (char *)0x0;
            }
            uVar37 = uVar37 + 1;
          } while (bVar17);
LAB_008dd19d:
          bVar16 = CNetAddr::IsValid((CNetAddr *)&addrConnect);
          iVar24 = 0;
          if (bVar16) {
            if (bVar20) {
              rel_time = RandomMixin<FastRandomContext>::
                         rand_uniform_duration<std::chrono::_V2::steady_clock>
                                   (&rng.super_RandomMixin<FastRandomContext>,(duration)0x3b9aca00);
              bVar16 = CThreadInterrupt::sleep_for(this_00,rel_time);
              iVar24 = 1;
              if (!bVar16) goto LAB_008dd3d3;
              pLVar29 = LogInstance();
              bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar29,NET,Debug);
              if (bVar16) {
                CService::ToStringAddrPort_abi_cxx11_((string *)&addr,&addrConnect.super_CService);
                source_file_07._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file_07._M_len = 0x50;
                logging_function_06._M_str = "ThreadOpenConnections";
                logging_function_06._M_len = 0x15;
                ::LogPrintf_<std::__cxx11::string>
                          (logging_function_06,source_file_07,0xaef,NET,Debug,
                           "Making feeler connection to %s\n",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &addr);
                if ((size_type *)
                    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
                    &addr.super_CService.super_CNetAddr.m_addr._size) {
                  operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents
                                  .indirect,
                                  CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                                           addr.super_CService.super_CNetAddr.m_addr._size) + 1);
                }
              }
            }
            if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                super__Optional_payload_base<Network>._M_engaged == true) {
              pLVar29 = LogInstance();
              bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar29,NET,Debug);
              if (bVar16) {
                CService::ToStringAddrPort_abi_cxx11_((string *)&addr,&addrConnect.super_CService);
                pbVar42 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          0x8dd2e1;
                GetNetworkName_abi_cxx11_
                          ((string *)&addr_2,
                           preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                           super__Optional_payload_base<Network>._M_payload._M_value);
                source_file_08._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file_08._M_len = 0x50;
                logging_function_07._M_str = "ThreadOpenConnections";
                logging_function_07._M_len = 0x15;
                ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                          (logging_function_07,source_file_08,0xaf2,NET,0xfc7788,(char *)&addr,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &addr_2,pbVar42);
                if ((size_type *)
                    addr_2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
                    &addr_2.super_CService.super_CNetAddr.m_addr._size) {
                  operator_delete(addr_2.super_CService.super_CNetAddr.m_addr._union.
                                  indirect_contents.indirect,
                                  addr_2.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
                }
                if ((size_type *)
                    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
                    &addr.super_CService.super_CNetAddr.m_addr._size) {
                  operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents
                                  .indirect,
                                  CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                                           addr.super_CService.super_CNetAddr.m_addr._size) + 1);
                }
              }
            }
            iVar36 = this->m_max_automatic_connections;
            if (2 < iVar36) {
              iVar36 = 3;
            }
            iVar24 = 0;
            OpenNetworkConnection
                      (this,&addrConnect,
                       iVar36 + -1 <=
                       local_460 +
                       (int)outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&grant,(char *)0x0,local_490._0_4_,
                       (bool)((byte)((uint)((undefined4)addrConnect.nServices &
                                           (int)this->nLocalServices) >> 0xb) & 1));
          }
        }
        else {
          if (local_430 < lVar28) {
            uVar26 = FastRandomContext::rand64(&rng);
            dVar11 = MakeExponentiallyDistributed(uVar26);
            local_430 = lVar28 + (long)ROUND(dVar11 * 120000000.0 + 0.5);
            local_490 = (longdouble)CONCAT64(local_490._4_6_,3);
            bVar20 = true;
            goto LAB_008dc670;
          }
          iVar24 = 10;
          if (((uVar37 == 8) && (this->m_max_outbound_full_relay == 8)) &&
             ((local_438 < lVar28 &&
              (bVar20 = MaybePickPreferredNetwork(this,&preferred_net), bVar20)))) {
            mVar33 = RandomMixin<FastRandomContext>::rand_exp_duration
                               (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
            local_438 = mVar33.__r + lVar28;
            goto LAB_008dc666;
          }
        }
LAB_008dd3d3:
        std::
        _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~_Rb_tree(&outbound_ipv46_peer_netgroups._M_t);
        if (0x10 < addrConnect.super_CService.super_CNetAddr.m_addr._size) {
          free(addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
          addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               (char *)0x0;
        }
        std::
        _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&fixed_seed_networks._M_h);
      }
      if (grant.fHaveGrant == true) {
        CSemaphore::post(grant.sem);
        grant.fHaveGrant = false;
      }
    } while ((iVar24 == 0) || (iVar24 == 10));
  }
  else {
    SVar4 = this->nLocalServices;
    uVar38 = 0;
    while( true ) {
      pcVar5 = (pointer)pbVar42->_M_string_length;
      for (pcVar39 = (pbVar42->_M_dataplus)._M_p; pcVar39 != pcVar5; pcVar39 = pcVar39 + 0x20) {
        CService::CService((CService *)&local_230.indirect_contents);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_230.indirect_contents)
        ;
        addr.super_CService.super_CNetAddr.m_net = local_218;
        addr.super_CService.super_CNetAddr.m_scope_id = uStack_214;
        addr.super_CService.port = local_210;
        addr.nTime.__d.__r = (duration)100000000;
        addr.nServices = NODE_NONE;
        if (0x10 < local_220) {
          free(local_230.indirect_contents.indirect);
          local_230.indirect_contents.indirect = (char *)0x0;
        }
        addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
             (char *)0x0;
        addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ =
             addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
        OpenNetworkConnection
                  (this,&addr,false,(CSemaphoreGrant *)&addrConnect,*(char **)pcVar39,MANUAL,
                   (bool)((byte)(SVar4 >> 0xb) & 1));
        if (addrConnect.super_CService.super_CNetAddr.m_addr._union.direct[8] == '\x01') {
          CSemaphore::post((CSemaphore *)
                           addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents
                           .indirect);
          addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ =
               addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
        }
        if (uVar38 != 0) {
          uVar35 = 0;
          do {
            bVar15 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
            if (!bVar15) {
              if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
                free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
                addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
              goto LAB_008db78c;
            }
          } while ((uVar35 < 9) && (uVar35 = uVar35 + 1, uVar35 < uVar38));
        }
        if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
          free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
          addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
        }
      }
      bVar15 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
      if (!bVar15) break;
      PerformReconnections(this);
      uVar38 = uVar38 + 1;
    }
  }
LAB_008db78c:
  ChaCha20::~ChaCha20(&rng.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::ThreadOpenConnections(const std::vector<std::string> connect, Span<const std::string> seed_nodes)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    AssertLockNotHeld(m_reconnections_mutex);
    FastRandomContext rng;
    // Connect to specific addresses
    if (!connect.empty())
    {
        // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
        // peer doesn't support it or immediately disconnects us for another reason.
        const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
        for (int64_t nLoop = 0;; nLoop++)
        {
            for (const std::string& strAddr : connect)
            {
                CAddress addr(CService(), NODE_NONE);
                OpenNetworkConnection(addr, false, {}, strAddr.c_str(), ConnectionType::MANUAL, /*use_v2transport=*/use_v2transport);
                for (int i = 0; i < 10 && i < nLoop; i++)
                {
                    if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                        return;
                }
            }
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                return;
            PerformReconnections();
        }
    }

    // Initiate network connections
    auto start = GetTime<std::chrono::microseconds>();

    // Minimum time before next feeler connection (in microseconds).
    auto next_feeler = start + rng.rand_exp_duration(FEELER_INTERVAL);
    auto next_extra_block_relay = start + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
    auto next_extra_network_peer{start + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL)};
    const bool dnsseed = gArgs.GetBoolArg("-dnsseed", DEFAULT_DNSSEED);
    bool add_fixed_seeds = gArgs.GetBoolArg("-fixedseeds", DEFAULT_FIXEDSEEDS);
    const bool use_seednodes{gArgs.IsArgSet("-seednode")};

    auto seed_node_timer = NodeClock::now();
    bool add_addr_fetch{addrman.Size() == 0 && !seed_nodes.empty()};
    constexpr std::chrono::seconds ADD_NEXT_SEEDNODE = 10s;

    if (!add_fixed_seeds) {
        LogPrintf("Fixed seeds are disabled\n");
    }

    while (!interruptNet)
    {
        if (add_addr_fetch) {
            add_addr_fetch = false;
            const auto& seed{SpanPopBack(seed_nodes)};
            AddAddrFetch(seed);

            if (addrman.Size() == 0) {
                LogInfo("Empty addrman, adding seednode (%s) to addrfetch\n", seed);
            } else {
                LogInfo("Couldn't connect to peers from addrman after %d seconds. Adding seednode (%s) to addrfetch\n", ADD_NEXT_SEEDNODE.count(), seed);
            }
        }

        ProcessAddrFetch();

        if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
            return;

        PerformReconnections();

        CSemaphoreGrant grant(*semOutbound);
        if (interruptNet)
            return;

        const std::unordered_set<Network> fixed_seed_networks{GetReachableEmptyNetworks()};
        if (add_fixed_seeds && !fixed_seed_networks.empty()) {
            // When the node starts with an empty peers.dat, there are a few other sources of peers before
            // we fallback on to fixed seeds: -dnsseed, -seednode, -addnode
            // If none of those are available, we fallback on to fixed seeds immediately, else we allow
            // 60 seconds for any of those sources to populate addrman.
            bool add_fixed_seeds_now = false;
            // It is cheapest to check if enough time has passed first.
            if (GetTime<std::chrono::seconds>() > start + std::chrono::minutes{1}) {
                add_fixed_seeds_now = true;
                LogPrintf("Adding fixed seeds as 60 seconds have passed and addrman is empty for at least one reachable network\n");
            }

            // Perform cheap checks before locking a mutex.
            else if (!dnsseed && !use_seednodes) {
                LOCK(m_added_nodes_mutex);
                if (m_added_node_params.empty()) {
                    add_fixed_seeds_now = true;
                    LogPrintf("Adding fixed seeds as -dnsseed=0 (or IPv4/IPv6 connections are disabled via -onlynet) and neither -addnode nor -seednode are provided\n");
                }
            }

            if (add_fixed_seeds_now) {
                std::vector<CAddress> seed_addrs{ConvertSeeds(m_params.FixedSeeds())};
                // We will not make outgoing connections to peers that are unreachable
                // (e.g. because of -onlynet configuration).
                // Therefore, we do not add them to addrman in the first place.
                // In case previously unreachable networks become reachable
                // (e.g. in case of -onlynet changes by the user), fixed seeds will
                // be loaded only for networks for which we have no addresses.
                seed_addrs.erase(std::remove_if(seed_addrs.begin(), seed_addrs.end(),
                                                [&fixed_seed_networks](const CAddress& addr) { return fixed_seed_networks.count(addr.GetNetwork()) == 0; }),
                                 seed_addrs.end());
                CNetAddr local;
                local.SetInternal("fixedseeds");
                addrman.Add(seed_addrs, local);
                add_fixed_seeds = false;
                LogPrintf("Added %d fixed seeds from reachable networks.\n", seed_addrs.size());
            }
        }

        //
        // Choose an address to connect to based on most recently seen
        //
        CAddress addrConnect;

        // Only connect out to one peer per ipv4/ipv6 network group (/16 for IPv4).
        int nOutboundFullRelay = 0;
        int nOutboundBlockRelay = 0;
        int outbound_privacy_network_peers = 0;
        std::set<std::vector<unsigned char>> outbound_ipv46_peer_netgroups;

        {
            LOCK(m_nodes_mutex);
            for (const CNode* pnode : m_nodes) {
                if (pnode->IsFullOutboundConn()) nOutboundFullRelay++;
                if (pnode->IsBlockOnlyConn()) nOutboundBlockRelay++;

                // Make sure our persistent outbound slots to ipv4/ipv6 peers belong to different netgroups.
                switch (pnode->m_conn_type) {
                    // We currently don't take inbound connections into account. Since they are
                    // free to make, an attacker could make them to prevent us from connecting to
                    // certain peers.
                    case ConnectionType::INBOUND:
                    // Short-lived outbound connections should not affect how we select outbound
                    // peers from addrman.
                    case ConnectionType::ADDR_FETCH:
                    case ConnectionType::FEELER:
                        break;
                    case ConnectionType::MANUAL:
                    case ConnectionType::OUTBOUND_FULL_RELAY:
                    case ConnectionType::BLOCK_RELAY:
                        const CAddress address{pnode->addr};
                        if (address.IsTor() || address.IsI2P() || address.IsCJDNS()) {
                            // Since our addrman-groups for these networks are
                            // random, without relation to the route we
                            // take to connect to these peers or to the
                            // difficulty in obtaining addresses with diverse
                            // groups, we don't worry about diversity with
                            // respect to our addrman groups when connecting to
                            // these networks.
                            ++outbound_privacy_network_peers;
                        } else {
                            outbound_ipv46_peer_netgroups.insert(m_netgroupman.GetGroup(address));
                        }
                } // no default case, so the compiler can warn about missing cases
            }
        }

        if (!seed_nodes.empty() && nOutboundFullRelay < SEED_OUTBOUND_CONNECTION_THRESHOLD) {
            if (NodeClock::now() > seed_node_timer + ADD_NEXT_SEEDNODE) {
                seed_node_timer = NodeClock::now();
                add_addr_fetch = true;
            }
        }

        ConnectionType conn_type = ConnectionType::OUTBOUND_FULL_RELAY;
        auto now = GetTime<std::chrono::microseconds>();
        bool anchor = false;
        bool fFeeler = false;
        std::optional<Network> preferred_net;

        // Determine what type of connection to open. Opening
        // BLOCK_RELAY connections to addresses from anchors.dat gets the highest
        // priority. Then we open OUTBOUND_FULL_RELAY priority until we
        // meet our full-relay capacity. Then we open BLOCK_RELAY connection
        // until we hit our block-relay-only peer limit.
        // GetTryNewOutboundPeer() gets set when a stale tip is detected, so we
        // try opening an additional OUTBOUND_FULL_RELAY connection. If none of
        // these conditions are met, check to see if it's time to try an extra
        // block-relay-only peer (to confirm our tip is current, see below) or the next_feeler
        // timer to decide if we should open a FEELER.

        if (!m_anchors.empty() && (nOutboundBlockRelay < m_max_outbound_block_relay)) {
            conn_type = ConnectionType::BLOCK_RELAY;
            anchor = true;
        } else if (nOutboundFullRelay < m_max_outbound_full_relay) {
            // OUTBOUND_FULL_RELAY
        } else if (nOutboundBlockRelay < m_max_outbound_block_relay) {
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (GetTryNewOutboundPeer()) {
            // OUTBOUND_FULL_RELAY
        } else if (now > next_extra_block_relay && m_start_extra_block_relay_peers) {
            // Periodically connect to a peer (using regular outbound selection
            // methodology from addrman) and stay connected long enough to sync
            // headers, but not much else.
            //
            // Then disconnect the peer, if we haven't learned anything new.
            //
            // The idea is to make eclipse attacks very difficult to pull off,
            // because every few minutes we're finding a new peer to learn headers
            // from.
            //
            // This is similar to the logic for trying extra outbound (full-relay)
            // peers, except:
            // - we do this all the time on an exponential timer, rather than just when
            //   our tip is stale
            // - we potentially disconnect our next-youngest block-relay-only peer, if our
            //   newest block-relay-only peer delivers a block more recently.
            //   See the eviction logic in net_processing.cpp.
            //
            // Because we can promote these connections to block-relay-only
            // connections, they do not get their own ConnectionType enum
            // (similar to how we deal with extra outbound peers).
            next_extra_block_relay = now + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (now > next_feeler) {
            next_feeler = now + rng.rand_exp_duration(FEELER_INTERVAL);
            conn_type = ConnectionType::FEELER;
            fFeeler = true;
        } else if (nOutboundFullRelay == m_max_outbound_full_relay &&
                   m_max_outbound_full_relay == MAX_OUTBOUND_FULL_RELAY_CONNECTIONS &&
                   now > next_extra_network_peer &&
                   MaybePickPreferredNetwork(preferred_net)) {
            // Full outbound connection management: Attempt to get at least one
            // outbound peer from each reachable network by making extra connections
            // and then protecting "only" peers from a network during outbound eviction.
            // This is not attempted if the user changed -maxconnections to a value
            // so low that less than MAX_OUTBOUND_FULL_RELAY_CONNECTIONS are made,
            // to prevent interactions with otherwise protected outbound peers.
            next_extra_network_peer = now + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL);
        } else {
            // skip to next iteration of while loop
            continue;
        }

        addrman.ResolveCollisions();

        const auto current_time{NodeClock::now()};
        int nTries = 0;
        while (!interruptNet)
        {
            if (anchor && !m_anchors.empty()) {
                const CAddress addr = m_anchors.back();
                m_anchors.pop_back();
                if (!addr.IsValid() || IsLocal(addr) || !g_reachable_nets.Contains(addr) ||
                    !m_msgproc->HasAllDesirableServiceFlags(addr.nServices) ||
                    outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) continue;
                addrConnect = addr;
                LogDebug(BCLog::NET, "Trying to make an anchor connection to %s\n", addrConnect.ToStringAddrPort());
                break;
            }

            // If we didn't find an appropriate destination after trying 100 addresses fetched from addrman,
            // stop this loop, and let the outer loop run again (which sleeps, adds seed nodes, recalculates
            // already-connected network ranges, ...) before trying new addrman addresses.
            nTries++;
            if (nTries > 100)
                break;

            CAddress addr;
            NodeSeconds addr_last_try{0s};

            if (fFeeler) {
                // First, try to get a tried table collision address. This returns
                // an empty (invalid) address if there are no collisions to try.
                std::tie(addr, addr_last_try) = addrman.SelectTriedCollision();

                if (!addr.IsValid()) {
                    // No tried table collisions. Select a new table address
                    // for our feeler.
                    std::tie(addr, addr_last_try) = addrman.Select(true);
                } else if (AlreadyConnectedToAddress(addr)) {
                    // If test-before-evict logic would have us connect to a
                    // peer that we're already connected to, just mark that
                    // address as Good(). We won't be able to initiate the
                    // connection anyway, so this avoids inadvertently evicting
                    // a currently-connected peer.
                    addrman.Good(addr);
                    // Select a new table address for our feeler instead.
                    std::tie(addr, addr_last_try) = addrman.Select(true);
                }
            } else {
                // Not a feeler
                // If preferred_net has a value set, pick an extra outbound
                // peer from that network. The eviction logic in net_processing
                // ensures that a peer from another network will be evicted.
                std::tie(addr, addr_last_try) = addrman.Select(false, preferred_net);
            }

            // Require outbound IPv4/IPv6 connections, other than feelers, to be to distinct network groups
            if (!fFeeler && outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) {
                continue;
            }

            // if we selected an invalid or local address, restart
            if (!addr.IsValid() || IsLocal(addr)) {
                break;
            }

            if (!g_reachable_nets.Contains(addr)) {
                continue;
            }

            // only consider very recently tried nodes after 30 failed attempts
            if (current_time - addr_last_try < 10min && nTries < 30) {
                continue;
            }

            // for non-feelers, require all the services we'll want,
            // for feelers, only require they be a full node (only because most
            // SPV clients don't have a good address DB available)
            if (!fFeeler && !m_msgproc->HasAllDesirableServiceFlags(addr.nServices)) {
                continue;
            } else if (fFeeler && !MayHaveUsefulAddressDB(addr.nServices)) {
                continue;
            }

            // Do not connect to bad ports, unless 50 invalid addresses have been selected already.
            if (nTries < 50 && (addr.IsIPv4() || addr.IsIPv6()) && IsBadPort(addr.GetPort())) {
                continue;
            }

            // Do not make automatic outbound connections to addnode peers, to
            // not use our limited outbound slots for them and to ensure
            // addnode connections benefit from their intended protections.
            if (AddedNodesContain(addr)) {
                LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "Not making automatic %s%s connection to %s peer selected for manual (addnode) connection%s\n",
                              preferred_net.has_value() ? "network-specific " : "",
                              ConnectionTypeAsString(conn_type), GetNetworkName(addr.GetNetwork()),
                              fLogIPs ? strprintf(": %s", addr.ToStringAddrPort()) : "");
                continue;
            }

            addrConnect = addr;
            break;
        }

        if (addrConnect.IsValid()) {
            if (fFeeler) {
                // Add small amount of random noise before connection to avoid synchronization.
                if (!interruptNet.sleep_for(rng.rand_uniform_duration<CThreadInterrupt::Clock>(FEELER_SLEEP_WINDOW))) {
                    return;
                }
                LogDebug(BCLog::NET, "Making feeler connection to %s\n", addrConnect.ToStringAddrPort());
            }

            if (preferred_net != std::nullopt) LogDebug(BCLog::NET, "Making network specific connection to %s on %s.\n", addrConnect.ToStringAddrPort(), GetNetworkName(preferred_net.value()));

            // Record addrman failure attempts when node has at least 2 persistent outbound connections to peers with
            // different netgroups in ipv4/ipv6 networks + all peers in Tor/I2P/CJDNS networks.
            // Don't record addrman failure attempts when node is offline. This can be identified since all local
            // network connections (if any) belong in the same netgroup, and the size of `outbound_ipv46_peer_netgroups` would only be 1.
            const bool count_failures{((int)outbound_ipv46_peer_netgroups.size() + outbound_privacy_network_peers) >= std::min(m_max_automatic_connections - 1, 2)};
            // Use BIP324 transport when both us and them have NODE_V2_P2P set.
            const bool use_v2transport(addrConnect.nServices & GetLocalServices() & NODE_P2P_V2);
            OpenNetworkConnection(addrConnect, count_failures, std::move(grant), /*strDest=*/nullptr, conn_type, use_v2transport);
        }
    }
}